

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.c
# Opt level: O0

void async_pipe_data(int *pipe_dsc,automaton *a,validator_mq_msg *prepared_msg)

{
  __pid_t pid;
  int iVar1;
  ssize_t sVar2;
  pid_t child_pid;
  ssize_t tmp_err;
  validator_mq_msg *prepared_msg_local;
  automaton *a_local;
  int *pipe_dsc_local;
  
  pid = fork();
  if (pid == -1) {
    err = true;
  }
  else {
    if (pid == 0) {
      validator_mq_finish(false,validator_mq,&err);
      if ((err & 1U) != 0) {
        kill_all_exit();
      }
      sVar2 = write(pipe_dsc[1],a,0x40c88);
      if (sVar2 != 0x40c88) {
        kill_all_exit();
      }
      sVar2 = write(pipe_dsc[1],prepared_msg,0x3f8);
      if (sVar2 != 0x3f8) {
        kill_all_exit();
      }
      iVar1 = close(pipe_dsc[1]);
      if (iVar1 == -1) {
        kill_all_exit();
      }
      exit(0);
    }
    await_forks = await_forks + 1;
    pid_list_emplace(children,pid,&err);
  }
  return;
}

Assistant:

static void async_pipe_data(int *pipe_dsc, const automaton *a, const validator_mq_msg *prepared_msg) {
    assert(!halt_flag_raised);
    assert(err == false);
    // assuming pipe dsc 0 is closed and pipe dsc 1 opened

    ssize_t tmp_err;
    pid_t child_pid;
    switch (child_pid = fork()) {
        case -1:
            err = true;
            break;
        case 0:
            validator_mq_finish(false, validator_mq, &err);
            HANDLE_ERR(kill_all_exit);

            // send automaton
            tmp_err = write(pipe_dsc[1], a, sizeof(automaton));
            if(tmp_err != sizeof(automaton)) {
                kill_all_exit();
            }
            // send prepared message
            tmp_err = write(pipe_dsc[1], prepared_msg, sizeof(validator_mq_msg));
            if(tmp_err != sizeof(validator_mq_msg)) {
                kill_all_exit();
            }
            // close pipe and exit
            tmp_err = close(pipe_dsc[1]);
            if(tmp_err == -1) {
                kill_all_exit();
            }
            exit(EXIT_SUCCESS);
        default:
            await_forks++;
            pid_list_emplace(children, child_pid, &err);
            break;
    }
}